

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void btSoftBody::PSolve_Links(btSoftBody *psb,btScalar kst,btScalar ti)

{
  btVector3 *v1;
  btVector3 *v2;
  uint uVar1;
  Link *pLVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  btScalar bVar7;
  float fVar8;
  float fVar9;
  btVector3 del;
  btVector3 local_78;
  ulong local_68;
  btSoftBody *local_60;
  btVector3 local_58;
  undefined1 local_48 [16];
  
  uVar1 = (psb->m_links).m_size;
  uVar6 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar6;
  }
  uVar5 = uVar5 * 0x48;
  local_68 = uVar5;
  local_60 = psb;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 0x48) {
    pLVar2 = (psb->m_links).m_data;
    if (0.0 < *(float *)((long)(pLVar2->m_c3).m_floats + (uVar6 - 0xc))) {
      lVar3 = *(long *)((long)pLVar2->m_n + uVar6);
      lVar4 = *(long *)((long)pLVar2->m_n + uVar6 + 8);
      v1 = (btVector3 *)(lVar4 + 0x10);
      v2 = (btVector3 *)(lVar3 + 0x10);
      local_78 = operator-(v1,v2);
      bVar7 = btVector3::length2(&local_78);
      fVar9 = *(float *)((long)(pLVar2->m_c3).m_floats + (uVar6 - 8));
      fVar8 = bVar7 + fVar9;
      uVar5 = local_68;
      psb = local_60;
      if (1.1920929e-07 < fVar8) {
        fVar9 = ((fVar9 - bVar7) /
                (fVar8 * *(float *)((long)(pLVar2->m_c3).m_floats + (uVar6 - 0xc)))) * kst;
        local_48 = ZEXT416((uint)fVar9);
        fVar9 = *(float *)(lVar3 + 0x60) * fVar9;
        local_58.m_floats[1] = fVar9 * local_78.m_floats[1];
        local_58.m_floats[0] = fVar9 * local_78.m_floats[0];
        local_58.m_floats[2] = fVar9 * local_78.m_floats[2];
        local_58.m_floats[3] = 0.0;
        btVector3::operator-=(v2,&local_58);
        fVar9 = (float)local_48._0_4_ * *(float *)(lVar4 + 0x60);
        local_58.m_floats[1] = fVar9 * local_78.m_floats[1];
        local_58.m_floats[0] = fVar9 * local_78.m_floats[0];
        local_58.m_floats[2] = fVar9 * local_78.m_floats[2];
        local_58.m_floats[3] = 0.0;
        btVector3::operator+=(v1,&local_58);
        uVar5 = local_68;
        psb = local_60;
      }
    }
  }
  return;
}

Assistant:

void				btSoftBody::PSolve_Links(btSoftBody* psb,btScalar kst,btScalar ti)
{
	for(int i=0,ni=psb->m_links.size();i<ni;++i)
	{			
		Link&	l=psb->m_links[i];
		if(l.m_c0>0)
		{
			Node&			a=*l.m_n[0];
			Node&			b=*l.m_n[1];
			const btVector3	del=b.m_x-a.m_x;
			const btScalar	len=del.length2();
			if (l.m_c1+len > SIMD_EPSILON)
			{
				const btScalar	k=((l.m_c1-len)/(l.m_c0*(l.m_c1+len)))*kst;
				a.m_x-=del*(k*a.m_im);
				b.m_x+=del*(k*b.m_im);
			}
		}
	}
}